

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostkey.c
# Opt level: O0

int hostkey_method_ssh_dss_signv
              (LIBSSH2_SESSION *session,uchar **signature,size_t *signature_len,int veccount,
              iovec *datavec,void **abstract)

{
  EVP_PKEY *dsactx_00;
  int iVar1;
  uchar *puVar2;
  int local_74;
  int i;
  EVP_MD_CTX *ctx;
  uchar hash [20];
  EVP_PKEY *dsactx;
  void **abstract_local;
  iovec *datavec_local;
  int veccount_local;
  size_t *signature_len_local;
  uchar **signature_local;
  LIBSSH2_SESSION *session_local;
  
  dsactx_00 = (EVP_PKEY *)*abstract;
  iVar1 = _libssh2_sha1_init((EVP_MD_CTX **)&stack0xffffffffffffff90);
  if (iVar1 == 0) {
    *signature = (uchar *)0x0;
    *signature_len = 0;
    session_local._4_4_ = -1;
  }
  else {
    puVar2 = (uchar *)_libssh2_calloc(session,0x28);
    *signature = puVar2;
    if (*signature == (uchar *)0x0) {
      session_local._4_4_ = -1;
    }
    else {
      *signature_len = 0x28;
      for (local_74 = 0; local_74 < veccount; local_74 = local_74 + 1) {
        iVar1 = _libssh2_sha1_update
                          ((EVP_MD_CTX **)&stack0xffffffffffffff90,datavec[local_74].iov_base,
                           datavec[local_74].iov_len);
        if (iVar1 == 0) {
          return -1;
        }
      }
      iVar1 = _libssh2_sha1_final((EVP_MD_CTX **)&stack0xffffffffffffff90,(uchar *)&ctx);
      if (iVar1 == 0) {
        session_local._4_4_ = -1;
      }
      else {
        iVar1 = _libssh2_dsa_sha1_sign(dsactx_00,(uchar *)&ctx,0x14,*signature);
        if (iVar1 == 0) {
          session_local._4_4_ = 0;
        }
        else {
          (*session->free)(*signature,&session->abstract);
          session_local._4_4_ = -1;
        }
      }
    }
  }
  return session_local._4_4_;
}

Assistant:

static int
hostkey_method_ssh_dss_signv(LIBSSH2_SESSION * session,
                             unsigned char **signature,
                             size_t *signature_len,
                             int veccount,
                             const struct iovec datavec[],
                             void **abstract)
{
    libssh2_dsa_ctx *dsactx = (libssh2_dsa_ctx *) (*abstract);
    unsigned char hash[SHA_DIGEST_LENGTH];
    libssh2_sha1_ctx ctx;
    int i;

    if(!libssh2_sha1_init(&ctx)) {
        *signature = NULL;
        *signature_len = 0;
        return -1;
    }

    *signature = LIBSSH2_CALLOC(session, 2 * SHA_DIGEST_LENGTH);
    if(!*signature) {
        return -1;
    }

    *signature_len = 2 * SHA_DIGEST_LENGTH;

    for(i = 0; i < veccount; i++) {
        if(!libssh2_sha1_update(ctx,
                                datavec[i].iov_base, datavec[i].iov_len)) {
            return -1;
        }
    }
    if(!libssh2_sha1_final(ctx, hash)) {
        return -1;
    }

    if(_libssh2_dsa_sha1_sign(dsactx, hash, SHA_DIGEST_LENGTH, *signature)) {
        LIBSSH2_FREE(session, *signature);
        return -1;
    }

    return 0;
}